

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O2

void * aom_memalign(size_t align,size_t size)

{
  void *pvVar1;
  void *pvVar2;
  
  if ((size <= 0x1fffffff9 - align) && (pvVar1 = malloc(align + size + 7), pvVar1 != (void *)0x0)) {
    pvVar2 = (void *)(-align & (long)pvVar1 + align + 7);
    *(void **)((long)pvVar2 + -8) = pvVar1;
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void *aom_memalign(size_t align, size_t size) {
  void *x = NULL;
  if (!check_size_argument_overflow(1, size, align)) return NULL;
  const size_t aligned_size = size + GetAllocationPaddingSize(align);
  void *const addr = malloc(aligned_size);
  if (addr) {
    x = aom_align_addr((unsigned char *)addr + ADDRESS_STORAGE_SIZE, align);
    SetActualMallocAddress(x, addr);
  }
  return x;
}